

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O2

void __thiscall fasttext::Vector::addVector(Vector *this,Vector *source,real s)

{
  float *pfVar1;
  float *pfVar2;
  size_t sVar3;
  size_t sVar4;
  
  sVar3 = (this->data_).size_;
  if (sVar3 == (source->data_).size_) {
    pfVar1 = (source->data_).mem_;
    pfVar2 = (this->data_).mem_;
    sVar4 = 0;
    if ((long)sVar3 < 1) {
      sVar3 = sVar4;
    }
    for (; sVar3 != sVar4; sVar4 = sVar4 + 1) {
      pfVar2[sVar4] = pfVar1[sVar4] * s + pfVar2[sVar4];
    }
    return;
  }
  __assert_fail("size() == source.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/olegtarasov[P]fastText/src/vector.cc"
                ,0x30,"void fasttext::Vector::addVector(const Vector &, real)");
}

Assistant:

void Vector::addVector(const Vector& source, real s) {
  assert(size() == source.size());
  for (int64_t i = 0; i < size(); i++) {
    data_[i] += s * source.data_[i];
  }
}